

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O3

msgs_t * allocateMsgs(picnic_instance_t *params)

{
  byte bVar1;
  ushort uVar2;
  msgs_t *__ptr;
  uint8_t *puVar3;
  ulong uVar4;
  msgs_t *pmVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar2 = params->num_rounds;
  __ptr = (msgs_t *)malloc((ulong)uVar2 * 0x90);
  if (__ptr != (msgs_t *)0x0) {
    bVar1 = params->num_MPC_parties;
    uVar7 = params->view_size + 7 & 0xfffffff8;
    puVar3 = (uint8_t *)calloc(1,(ulong)((uint)uVar2 * (uint)bVar1 * uVar7));
    if (puVar3 != (uint8_t *)0x0) {
      if ((ulong)uVar2 == 0) {
        return __ptr;
      }
      uVar4 = 0;
      pmVar5 = __ptr;
      do {
        __ptr[uVar4].pos = 0;
        __ptr[uVar4].unopened = -1;
        if ((ulong)bVar1 != 0) {
          uVar6 = 0;
          do {
            pmVar5->msgs[uVar6] = puVar3;
            puVar3 = puVar3 + uVar7;
            uVar6 = uVar6 + 1;
          } while (bVar1 != uVar6);
        }
        uVar4 = uVar4 + 1;
        pmVar5 = pmVar5 + 1;
      } while (uVar4 != uVar2);
      return __ptr;
    }
    free(__ptr);
  }
  return (msgs_t *)0x0;
}

Assistant:

msgs_t* allocateMsgs(const picnic_instance_t* params) {
  msgs_t* msgs = malloc(params->num_rounds * sizeof(msgs_t));
  if (!msgs) {
    return NULL;
  }

  uint8_t* slab =
      calloc(1, params->num_rounds * params->num_MPC_parties * ((params->view_size + 7) / 8 * 8));
  if (!slab) {
    free(msgs);
    return NULL;
  }

  for (uint32_t i = 0; i < params->num_rounds; i++) {
    msgs[i].pos      = 0;
    msgs[i].unopened = -1;

    for (uint32_t j = 0; j < params->num_MPC_parties; j++) {
      msgs[i].msgs[j] = slab;
      slab += (params->view_size + 7) / 8 * 8;
    }
  }

  return msgs;
}